

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap(Int64ToDoubleMap *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64ToDoubleMap_006fbf90;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->map_).arena_ = (Arena *)0x0;
  *(undefined8 *)((long)&(this->map_).arena_ + 4) = 0;
  *(undefined8 *)((long)&(this->map_).map_.arena_ + 4) = 0;
  google::protobuf::Map<long,_double>::Init(&(this->map_).map_);
  (this->map_).map_.default_enum_value_ = 0;
  if (this != (Int64ToDoubleMap *)&_Int64ToDoubleMap_default_instance_) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

Int64ToDoubleMap::Int64ToDoubleMap()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Int64ToDoubleMap)
}